

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MatchingTest_DontReportMatchedWhenIgnoring_Test::TestBody
          (MatchingTest_DontReportMatchedWhenIgnoring_Test *this)

{
  bool bVar1;
  Descriptor *this_00;
  FieldDescriptor *field;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_318;
  Message local_310;
  undefined1 local_308 [8];
  AssertionResult gtest_ar;
  AssertHelper local_2d8;
  Message local_2d0;
  bool local_2c1;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_2a0 [8];
  MessageDifferencer differencer;
  string output;
  undefined1 local_c0 [8];
  TestField msg2;
  TestField msg1;
  MatchingTest_DontReportMatchedWhenIgnoring_Test *this_local;
  
  proto2_unittest::TestField::TestField((TestField *)((long)&msg2.field_0 + 0x40));
  proto2_unittest::TestField::TestField((TestField *)local_c0);
  proto2_unittest::TestField::set_c((TestField *)((long)&msg2.field_0 + 0x40),0x48);
  proto2_unittest::TestField::set_c((TestField *)local_c0,0x48);
  proto2_unittest::TestField::add_rc((TestField *)((long)&msg2.field_0 + 0x40),0xd);
  proto2_unittest::TestField::add_rc((TestField *)local_c0,0xd);
  proto2_unittest::TestField::add_rc((TestField *)((long)&msg2.field_0 + 0x40),0x11);
  proto2_unittest::TestField::add_rc((TestField *)local_c0,0x11);
  std::__cxx11::string::string((string *)&differencer.unpack_any_field_);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)local_2a0);
  util::MessageDifferencer::set_report_matches((MessageDifferencer *)local_2a0,true);
  util::MessageDifferencer::ReportDifferencesToString
            ((MessageDifferencer *)local_2a0,(string *)&differencer.unpack_any_field_);
  this_00 = proto2_unittest::TestField::GetDescriptor();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_,"c");
  field = Descriptor::FindFieldByName(this_00,stack0xfffffffffffffd50);
  util::MessageDifferencer::IgnoreField((MessageDifferencer *)local_2a0,field);
  local_2c1 = util::MessageDifferencer::Compare
                        ((MessageDifferencer *)local_2a0,(Message *)((long)&msg2.field_0 + 0x40),
                         (Message *)local_c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2c0,&local_2c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_2c0,(AssertionResult *)0x1ebd035,
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xfbb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  testing::internal::EqHelper::
  Compare<char[52],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_308,
             "\"ignored: c\\n\" \"matched: rc[0] : 13\\n\" \"matched: rc[1] : 17\\n\"","output",
             (char (*) [52])"ignored: c\nmatched: rc[0] : 13\nmatched: rc[1] : 17\n",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &differencer.unpack_any_field_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xfc0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_318,&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)local_2a0);
  std::__cxx11::string::~string((string *)&differencer.unpack_any_field_);
  proto2_unittest::TestField::~TestField((TestField *)local_c0);
  proto2_unittest::TestField::~TestField((TestField *)((long)&msg2.field_0 + 0x40));
  return;
}

Assistant:

TEST_F(MatchingTest, DontReportMatchedWhenIgnoring) {
  proto2_unittest::TestField msg1, msg2;
  msg1.set_c(72);
  msg2.set_c(72);
  msg1.add_rc(13);
  msg2.add_rc(13);
  msg1.add_rc(17);
  msg2.add_rc(17);
  std::string output;
  MessageDifferencer differencer;
  differencer.set_report_matches(true);
  differencer.ReportDifferencesToString(&output);

  differencer.IgnoreField(msg1.GetDescriptor()->FindFieldByName("c"));

  EXPECT_TRUE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "ignored: c\n"
      "matched: rc[0] : 13\n"
      "matched: rc[1] : 17\n",
      output);
}